

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
google::protobuf::Arena::Create<std::__cxx11::string>(Arena *arena)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar2;
  
  if (arena == (Arena *)0x0) {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
  }
  else {
    pVar2 = AllocateAlignedWithCleanup(arena,0x20,(type_info *)&std::__cxx11::string::typeinfo);
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar2.first;
    (pVar2.second)->elem = pbVar1;
    (pVar2.second)->cleanup = internal::arena_destruct_object<std::__cxx11::string>;
  }
  (pbVar1->_M_dataplus)._M_p = (pointer)&pbVar1->field_2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  return pbVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* Create(Arena* arena, Args&&... args) {
    return CreateInternal<T>(arena, std::is_convertible<T*, MessageLite*>(),
                             static_cast<Args&&>(args)...);
  }